

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

bool __thiscall
deqp::UniformBlockCase::compareStd140Blocks
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  ostringstream *poVar1;
  pointer pUVar2;
  ostringstream *this_00;
  ostringstream *poVar3;
  UniformBlock *pUVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pUVar7;
  UniformLayout *pUVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  MessageBuilder *pMVar12;
  ulong uVar13;
  bool *__rhs;
  int *piVar14;
  bool bVar15;
  string instanceName;
  allocator<char> local_209;
  TestLog *local_208;
  vector<int,_std::allocator<int>_> *local_200;
  UniformLayout *local_1f8;
  UniformLayout *local_1f0;
  UniformBlockCase *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [384];
  
  local_208 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar13 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                         super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_uniformBlocks.
                        super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1d8 = 0;
  local_1e0 = uVar13 & 0xffffffff;
  if ((int)uVar13 < 1) {
    local_1e0 = local_1d8;
  }
  bVar15 = true;
  local_1f8 = refLayout;
  local_1f0 = cmpLayout;
  local_1e8 = this;
  do {
    if (local_1d8 == local_1e0) {
      return bVar15;
    }
    pUVar4 = (this->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1d8];
    iVar9 = pUVar4->m_arraySize;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,(pUVar4->m_blockName)._M_dataplus._M_p,&local_209);
    __rhs = glcts::fixed_sample_locations_values + 1;
    if (0 < iVar9) {
      __rhs = (bool *)0x166ac1c;
    }
    std::operator+(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   __rhs);
    std::__cxx11::string::~string((string *)local_1b0);
    iVar9 = ub::UniformLayout::getBlockIndex(local_1f8,local_1d0._M_dataplus._M_p);
    uVar10 = ub::UniformLayout::getBlockIndex(local_1f0,local_1d0._M_dataplus._M_p);
    if ((pUVar4->m_flags & 0x20) != 0) {
      if ((int)uVar10 < 0) {
        if ((pUVar4->m_flags & 0x300) != 0) {
          local_1b0._0_8_ = local_208;
          poVar3 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Error: Uniform block \'");
          std::operator<<((ostream *)poVar3,(string *)&local_1d0);
          std::operator<<((ostream *)poVar3,"\' not found");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          bVar15 = false;
        }
      }
      else {
        pBVar5 = (local_1f8->blocks).
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar6 = (local_1f0->blocks).
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_200 = &pBVar5[iVar9].activeUniformIndices;
        piVar14 = *(int **)&(local_200->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
        if ((long)*(pointer *)
                   ((long)&pBVar5[iVar9].activeUniformIndices.
                           super__Vector_base<int,_std::allocator<int>_> + 8) - (long)piVar14 !=
            (long)*(pointer *)
                   ((long)&pBVar6[uVar10].activeUniformIndices.
                           super__Vector_base<int,_std::allocator<int>_> + 8) -
            *(long *)&pBVar6[uVar10].activeUniformIndices.
                      super__Vector_base<int,_std::allocator<int>_>) {
          local_1b0._0_8_ = local_208;
          poVar3 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Error: Number of active uniforms differ in block \'");
          std::operator<<((ostream *)poVar3,(string *)&local_1d0);
          std::operator<<((ostream *)poVar3,"\' (expected ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<((ostream *)poVar3,", got ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<((ostream *)poVar3,")");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          piVar14 = *(int **)&(local_200->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
          bVar15 = false;
        }
        for (; pUVar8 = local_1f0, this = local_1e8,
            piVar14 !=
            *(pointer *)
             ((long)&(local_200->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8);
            piVar14 = piVar14 + 1) {
          pUVar7 = (local_1f8->uniforms).
                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pUVar2 = pUVar7 + *piVar14;
          uVar10 = ub::UniformLayout::getUniformIndex
                             (local_1f0,pUVar7[*piVar14].name._M_dataplus._M_p);
          if ((int)uVar10 < 0) {
            local_1b0._0_8_ = local_208;
            poVar3 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::operator<<((ostream *)poVar3,"Error: Uniform \'");
            std::operator<<((ostream *)poVar3,(string *)pUVar2);
            std::operator<<((ostream *)poVar3,"\' not found");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d94449:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
            bVar15 = false;
          }
          else {
            pUVar7 = (pUVar8->uniforms).
                     super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((((pUVar2->type != pUVar7[uVar10].type) || (pUVar2->size != pUVar7[uVar10].size)) ||
                (pUVar2->offset != pUVar7[uVar10].offset)) ||
               (((pUVar2->arrayStride != pUVar7[uVar10].arrayStride ||
                 (pUVar2->matrixStride != pUVar7[uVar10].matrixStride)) ||
                (pUVar2->isRowMajor != pUVar7[uVar10].isRowMajor)))) {
              local_1b0._0_8_ = local_208;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::operator<<((ostream *)this_00,"Error: Layout mismatch in \'");
              std::operator<<((ostream *)this_00,(string *)pUVar2);
              std::operator<<((ostream *)this_00,"\':\n");
              std::operator<<((ostream *)this_00,"  expected: type = ");
              pcVar11 = glu::getDataTypeName(pUVar2->type);
              std::operator<<((ostream *)this_00,pcVar11);
              std::operator<<((ostream *)this_00,", size = ");
              pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&pUVar2->size);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", offset = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar2->offset);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", array stride = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar2->arrayStride);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", matrix stride = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar2->matrixStride);
              poVar1 = &pMVar12->m_str;
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              ", row major = ");
              pcVar11 = "false";
              if (pUVar2->isRowMajor != false) {
                pcVar11 = "true";
              }
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar11);
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              "  got: type = ");
              pcVar11 = glu::getDataTypeName(pUVar7[uVar10].type);
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar11);
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              ", size = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar7[uVar10].size);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", offset = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar7[uVar10].offset);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", array stride = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar7[uVar10].arrayStride);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", matrix stride = ");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pUVar7[uVar10].matrixStride);
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", row major = ");
              pcVar11 = "false";
              if (pUVar7[uVar10].isRowMajor != false) {
                pcVar11 = "true";
              }
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              pcVar11);
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00d94449;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_1d0);
    local_1d8 = local_1d8 + 1;
  } while( true );
}

Assistant:

bool UniformBlockCase::compareStd140Blocks(const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog& log	   = m_testCtx.getLog();
	bool	 isOk	  = true;
	int		 numBlocks = m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock& block		 = m_interface.getUniformBlock(blockNdx);
		bool				isArray		 = block.isArray();
		std::string			instanceName = string(block.getBlockName()) + (isArray ? "[0]" : "");
		int					refBlockNdx  = refLayout.getBlockIndex(instanceName.c_str());
		int					cmpBlockNdx  = cmpLayout.getBlockIndex(instanceName.c_str());
		bool				isUsed		 = (block.getFlags() & (DECLARE_VERTEX | DECLARE_FRAGMENT)) != 0;

		if ((block.getFlags() & LAYOUT_STD140) == 0)
			continue; // Not std140 layout.

		DE_ASSERT(refBlockNdx >= 0);

		if (cmpBlockNdx < 0)
		{
			// Not found, should it?
			if (isUsed)
			{
				log << TestLog::Message << "Error: Uniform block '" << instanceName << "' not found"
					<< TestLog::EndMessage;
				isOk = false;
			}

			continue; // Skip block.
		}

		const BlockLayoutEntry& refBlockLayout = refLayout.blocks[refBlockNdx];
		const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

		// \todo [2012-01-24 pyry] Verify that activeUniformIndices is correct.
		// \todo [2012-01-24 pyry] Verify all instances.
		if (refBlockLayout.activeUniformIndices.size() != cmpBlockLayout.activeUniformIndices.size())
		{
			log << TestLog::Message << "Error: Number of active uniforms differ in block '" << instanceName
				<< "' (expected " << refBlockLayout.activeUniformIndices.size() << ", got "
				<< cmpBlockLayout.activeUniformIndices.size() << ")" << TestLog::EndMessage;
			isOk = false;
		}

		for (vector<int>::const_iterator ndxIter = refBlockLayout.activeUniformIndices.begin();
			 ndxIter != refBlockLayout.activeUniformIndices.end(); ndxIter++)
		{
			const UniformLayoutEntry& refEntry	= refLayout.uniforms[*ndxIter];
			int						  cmpEntryNdx = cmpLayout.getUniformIndex(refEntry.name.c_str());

			if (cmpEntryNdx < 0)
			{
				log << TestLog::Message << "Error: Uniform '" << refEntry.name << "' not found" << TestLog::EndMessage;
				isOk = false;
				continue;
			}

			const UniformLayoutEntry& cmpEntry = cmpLayout.uniforms[cmpEntryNdx];

			if (refEntry.type != cmpEntry.type || refEntry.size != cmpEntry.size ||
				refEntry.offset != cmpEntry.offset || refEntry.arrayStride != cmpEntry.arrayStride ||
				refEntry.matrixStride != cmpEntry.matrixStride || refEntry.isRowMajor != cmpEntry.isRowMajor)
			{
				log << TestLog::Message << "Error: Layout mismatch in '" << refEntry.name << "':\n"
					<< "  expected: type = " << glu::getDataTypeName(refEntry.type) << ", size = " << refEntry.size
					<< ", offset = " << refEntry.offset << ", array stride = " << refEntry.arrayStride
					<< ", matrix stride = " << refEntry.matrixStride
					<< ", row major = " << (refEntry.isRowMajor ? "true" : "false") << "\n"
					<< "  got: type = " << glu::getDataTypeName(cmpEntry.type) << ", size = " << cmpEntry.size
					<< ", offset = " << cmpEntry.offset << ", array stride = " << cmpEntry.arrayStride
					<< ", matrix stride = " << cmpEntry.matrixStride
					<< ", row major = " << (cmpEntry.isRowMajor ? "true" : "false") << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}